

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBars<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,unsigned_long_long *err
               ,int count,int offset,int stride)

{
  GetterError<unsigned_long_long> local_30;
  
  if (count == 0) {
    local_30.Offset = 0;
  }
  else {
    local_30.Offset = (offset % count + count) % count;
  }
  local_30.Stride = stride;
  local_30.Xs = xs;
  local_30.Ys = ys;
  local_30.Neg = err;
  local_30.Pos = err;
  local_30.Count = count;
  PlotErrorBarsEx<ImPlot::GetterError<unsigned_long_long>>(label_id,&local_30);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* err, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, err, err, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}